

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O3

expected<void,_std::error_code> * __thiscall
jaegertracing::Tracer::Inject
          (expected<void,_std::error_code> *__return_storage_ptr__,Tracer *this,SpanContext *ctx,
          TextMapWriter *writer)

{
  error_category *peVar1;
  SpanContext *ctx_00;
  
  ctx_00 = (SpanContext *)
           __dynamic_cast(ctx,&opentracing::v3::SpanContext::typeinfo,&SpanContext::typeinfo,0);
  peVar1 = DAT_00270638;
  if (ctx_00 == (SpanContext *)0x0) {
    (__return_storage_ptr__->contained).m_error._M_value =
         opentracing::v3::invalid_span_context_error;
    (__return_storage_ptr__->contained).m_error._M_cat = peVar1;
  }
  else {
    propagation::
    Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>::
    inject(&this->_textPropagator,ctx_00,writer);
  }
  __return_storage_ptr__->has_value_ = ctx_00 != (SpanContext *)0x0;
  return __return_storage_ptr__;
}

Assistant:

opentracing::expected<void>
    Inject(const opentracing::SpanContext& ctx,
           const opentracing::TextMapWriter& writer) const override
    {
        const auto* jaegerCtx = dynamic_cast<const SpanContext*>(&ctx);
        if (!jaegerCtx) {
            return opentracing::make_expected_from_error<void>(
                opentracing::invalid_span_context_error);
        }
        _textPropagator.inject(*jaegerCtx, writer);
        return opentracing::make_expected();
    }